

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

bool __thiscall Jinx::Impl::Lexer::IsName(Lexer *this,char *ptr)

{
  byte bVar1;
  
  bVar1 = *ptr;
  if ((((bVar1 != 9) && (bVar1 != 0x20)) && (0x20 < bVar1)) &&
     (((0x36 < bVar1 - 0x27 || ((0x500000000001a7U >> ((ulong)(bVar1 - 0x27) & 0x3f) & 1) == 0)) &&
      ((bVar1 != 0x7b && (bVar1 != 0x7d)))))) {
    return true;
  }
  return false;
}

Assistant:

inline_t bool Lexer::IsName(const char * ptr) const
	{
		char c = *ptr;
		if (IsWhitespace(c) || IsNewline(c))
			return false;
		if (static_cast<unsigned char>(c) <= 32)
			return false;
		if (c == ',' || c == '.' || c == '[' || c == ']' || c == '(' || c == ')' || c == '{' || c == '}' || c == '/' || c == '\'')
			return false;
		return true;
	}